

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O2

MemoryRegion *
memory_cow_sparc64(uc_struct_conflict9 *uc,MemoryRegion *current,hwaddr begin,size_t size)

{
  hwaddr hVar1;
  undefined1 a [16];
  Int128 IVar2;
  MemoryRegion *mr;
  MemoryRegion *pMVar3;
  void *__dest;
  void *__src;
  hwaddr offset;
  undefined8 in_stack_ffffffffffffffb8;
  
  mr = (MemoryRegion *)g_malloc(0xa0);
  pMVar3 = current->container;
  if (pMVar3 == uc->system_memory) {
    hVar1 = current->addr;
    pMVar3 = (MemoryRegion *)g_malloc(0xa0);
    IVar2 = current->size;
    a._8_8_ = size;
    a._0_8_ = in_stack_ffffffffffffffb8;
    int128_get64((Int128)a);
    memory_region_init_sparc64(uc,pMVar3,(uint64_t)IVar2);
    memory_region_del_subregion_sparc64(uc->system_memory,current);
    memory_region_add_subregion_common(pMVar3,0,current);
    memory_region_add_subregion_sparc64(uc->system_memory,hVar1,pMVar3);
    pMVar3 = current->container;
  }
  offset = begin - pMVar3->addr;
  hVar1 = current->addr;
  memory_region_init_ram_sparc64(uc,mr,size,current->perms);
  if ((mr->addr == 0xffffffffffffffff) || (mr->ram_block == (RAMBlock *)0x0)) {
    g_free(mr);
    mr = (MemoryRegion *)0x0;
  }
  else {
    __dest = ramblock_ptr(mr->ram_block,0);
    __src = ramblock_ptr(current->ram_block,offset - hVar1);
    memcpy(__dest,__src,size);
    pMVar3 = current->container;
    mr->priority = uc->snapshot_level;
    memory_region_add_subregion_common(pMVar3,offset,mr);
    if (uc->cpu != (CPUState *)0x0) {
      tlb_flush_sparc64(uc->cpu);
    }
    uc->memory_region_update_pending = true;
    memory_region_transaction_commit_sparc64(mr);
  }
  return mr;
}

Assistant:

MemoryRegion *memory_cow(struct uc_struct *uc, MemoryRegion *current, hwaddr begin, size_t size)
{
    hwaddr offset;
    hwaddr current_offset;
    MemoryRegion *ram = g_new(MemoryRegion, 1);

    if (current->container == uc->system_memory) {
        make_contained(uc, current);
    }
    offset = begin - current->container->addr;;
    current_offset = offset - current->addr;

    memory_region_init_ram(uc, ram, size, current->perms);
    if (ram->addr == -1 || !ram->ram_block) {
        g_free(ram);
        return NULL;
    }
    memory_region_transaction_begin();

    memcpy(ramblock_ptr(ram->ram_block, 0), ramblock_ptr(current->ram_block, current_offset), size);
    memory_region_add_subregion_overlap(current->container, offset, ram, uc->snapshot_level);

    if (uc->cpu) {
        tlb_flush(uc->cpu);
    }

    uc->memory_region_update_pending = true;
    memory_region_transaction_commit(ram);

    return ram;
}